

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O0

void usage(int argc,char **argv)

{
  undefined8 *in_RSI;
  
  fprintf(_stderr,"Usage: %s [OPTIONS] FILE\n",*in_RSI);
  fprintf(_stderr,"Inspect LRIT files.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"  -x, --extract  Print data section of file\n");
  fprintf(_stderr,"  -j, --json     Print header in JSON format\n");
  fprintf(_stderr,"      --help     Show this help\n");
  fprintf(_stderr,"\n");
  exit(0);
}

Assistant:

void usage(int argc, char** argv) {
  fprintf(stderr, "Usage: %s [OPTIONS] FILE\n", argv[0]);
  fprintf(stderr, "Inspect LRIT files.\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "Options:\n");
  fprintf(stderr, "  -x, --extract  Print data section of file\n");
  fprintf(stderr, "  -j, --json     Print header in JSON format\n");
  fprintf(stderr, "      --help     Show this help\n");
  fprintf(stderr, "\n");
  exit(0);
}